

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physical_operator.cpp
# Opt level: O3

bool duckdb::PhysicalOperator::OperatorCachingAllowed(ExecutionContext *context)

{
  bool bVar1;
  byte bVar2;
  optional_ptr<duckdb::Pipeline,_true> *this;
  OperatorPartitionInfo partition_info;
  optional_ptr<duckdb::PhysicalOperator,_true> local_38;
  byte local_30 [8];
  void *local_28;
  void *local_20;
  
  if (((context->client->config).enable_caching_operators == true) &&
     ((context->pipeline).ptr != (Pipeline *)0x0)) {
    this = &context->pipeline;
    optional_ptr<duckdb::Pipeline,_true>::CheckValid(this);
    if ((this->ptr->sink).ptr != (PhysicalOperator *)0x0) {
      optional_ptr<duckdb::Pipeline,_true>::CheckValid(this);
      bVar1 = Pipeline::IsOrderDependent(this->ptr);
      if (!bVar1) {
        optional_ptr<duckdb::Pipeline,_true>::CheckValid(this);
        local_38.ptr = (this->ptr->sink).ptr;
        optional_ptr<duckdb::PhysicalOperator,_true>::CheckValid(&local_38);
        (*(local_38.ptr)->_vptr_PhysicalOperator[0x23])(local_30);
        if (local_28 != (void *)0x0) {
          operator_delete(local_28);
        }
        bVar2 = (local_28 != local_20 | local_30[0]) ^ 1;
        goto LAB_00f4fc35;
      }
    }
  }
  bVar2 = 0;
LAB_00f4fc35:
  return (bool)(bVar2 & 1);
}

Assistant:

bool PhysicalOperator::OperatorCachingAllowed(ExecutionContext &context) {
	if (!context.client.config.enable_caching_operators) {
		return false;
	} else if (!context.pipeline) {
		return false;
	} else if (!context.pipeline->GetSink()) {
		return false;
	} else if (context.pipeline->IsOrderDependent()) {
		return false;
	} else {
		auto partition_info = context.pipeline->GetSink()->RequiredPartitionInfo();
		if (partition_info.AnyRequired()) {
			return false;
		}
	}

	return true;
}